

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# imgui_internal.h
# Opt level: O1

void __thiscall ImGuiListClipperData::Reset(ImGuiListClipperData *this,ImGuiListClipper *clipper)

{
  int *piVar1;
  int iVar2;
  ImGuiListClipperRange *pIVar3;
  ImGuiListClipperRange *__dest;
  uint uVar4;
  ulong uVar5;
  
  this->ListClipper = clipper;
  this->StepNo = 0;
  this->ItemsFrozen = 0;
  iVar2 = (this->Ranges).Capacity;
  if (iVar2 < 0) {
    uVar4 = iVar2 / 2 + iVar2;
    uVar5 = 0;
    if (0 < (int)uVar4) {
      uVar5 = (ulong)uVar4;
    }
    if (GImGui != (ImGuiContext *)0x0) {
      piVar1 = &(GImGui->IO).MetricsActiveAllocations;
      *piVar1 = *piVar1 + 1;
    }
    __dest = (ImGuiListClipperRange *)(*GImAllocatorAllocFunc)(uVar5 * 0xc,GImAllocatorUserData);
    pIVar3 = (this->Ranges).Data;
    if (pIVar3 != (ImGuiListClipperRange *)0x0) {
      memcpy(__dest,pIVar3,(long)(this->Ranges).Size * 0xc);
      pIVar3 = (this->Ranges).Data;
      if ((pIVar3 != (ImGuiListClipperRange *)0x0) && (GImGui != (ImGuiContext *)0x0)) {
        piVar1 = &(GImGui->IO).MetricsActiveAllocations;
        *piVar1 = *piVar1 + -1;
      }
      (*GImAllocatorFreeFunc)(pIVar3,GImAllocatorUserData);
    }
    (this->Ranges).Data = __dest;
    (this->Ranges).Capacity = (int)uVar5;
  }
  (this->Ranges).Size = 0;
  return;
}

Assistant:

void                            Reset(ImGuiListClipper* clipper) { ListClipper = clipper; StepNo = ItemsFrozen = 0; Ranges.resize(0); }